

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose.h
# Opt level: O2

Matrix33d * gmath::getRotation(Matrix33d *__return_storage_ptr__,Vector6d *pose)

{
  double s;
  SVector<double,_3> local_48;
  SVector<double,_3> local_28;
  
  local_48.v[2] = pose->v[5];
  local_48.v[0] = pose->v[3];
  local_48.v[1] = pose->v[4];
  s = norm<double,3>(&local_48);
  if ((s != 0.0) || (NAN(s))) {
    SVector<double,_3>::operator/(&local_28,&local_48,s);
    createR(__return_storage_ptr__,&local_28,s);
  }
  else {
    SMatrix<double,_3,_3>::SMatrix(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

inline Matrix33d getRotation(const Vector6d &pose)
{
  Vector3d n(pose[3], pose[4], pose[5]);
  double phi=norm(n);

  if (phi != 0)
  {
    return createR(n/phi, phi);
  }

  return Matrix33d();
}